

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_ActivateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_Session *session,
               UA_ActivateSessionRequest *request,UA_ActivateSessionResponse *response)

{
  UA_SecureChannel *pUVar1;
  UA_DataType *pUVar2;
  UA_String *pUVar3;
  UA_UsernamePasswordLogin *pUVar4;
  UA_Boolean UVar5;
  UA_DateTime UVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  bool bVar11;
  undefined1 local_80 [8];
  UA_String ap;
  UA_String up;
  
  lVar10 = session->validTill;
  UVar6 = UA_DateTime_nowMonotonic();
  if (lVar10 < UVar6) {
    pUVar1 = session->channel;
    if (pUVar1 == (UA_SecureChannel *)0x0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      if (pUVar1->connection == (UA_Connection *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(uint)pUVar1->connection->sockfd;
      }
      uVar8 = (ulong)(pUVar1->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the session has timed out"
                ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],
                (ulong)(channel->securityToken).channelId);
    (response->responseHeader).serviceResult = 0x80250000;
    return;
  }
  if (((request->userIdentityToken).encoding < UA_EXTENSIONOBJECT_DECODED) ||
     (pUVar2 = (request->userIdentityToken).content.decoded.type,
     pUVar2 != (UA_DataType *)0x13c290 && pUVar2 != (UA_DataType *)0x13bc00)) {
    pUVar1 = session->channel;
    if (pUVar1 == (UA_SecureChannel *)0x0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      if (pUVar1->connection == (UA_Connection *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(uint)pUVar1->connection->sockfd;
      }
      uVar8 = (ulong)(pUVar1->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the UserIdentify token is invalid"
                ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],
                (ulong)(channel->securityToken).channelId);
  }
  else {
    _local_80 = UA_STRING("open62541-anonymous-policy");
    join_0x00000010_0x00000000_ = UA_STRING("open62541-username-policy");
    if ((pUVar2 == (UA_DataType *)0x13bc00) && ((server->config).enableAnonymousLogin != false)) {
      pUVar3 = (UA_String *)(request->userIdentityToken).content.decoded.data;
      if ((pUVar3->data == (UA_Byte *)0x0) ||
         (UVar5 = UA_String_equal(pUVar3,(UA_String *)local_80), UVar5)) {
LAB_0011b45c:
        pUVar1 = session->channel;
        if (pUVar1 != channel && pUVar1 != (UA_SecureChannel *)0x0) {
          if (pUVar1->connection == (UA_Connection *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(uint)pUVar1->connection->sockfd;
          }
          UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                      "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Detach from old channel"
                      ,uVar7,(ulong)(pUVar1->securityToken).channelId,
                      (ulong)(session->sessionId).identifier.numeric,
                      (ulong)(session->sessionId).identifier.guid.data2,
                      (ulong)(session->sessionId).identifier.guid.data3,
                      (ulong)(session->sessionId).identifier.guid.data4[0],
                      (ulong)(session->sessionId).identifier.guid.data4[1],
                      (ulong)(session->sessionId).identifier.guid.data4[2],
                      (ulong)(session->sessionId).identifier.guid.data4[3],
                      (ulong)(session->sessionId).identifier.guid.data4[4],
                      (ulong)(session->sessionId).identifier.guid.data4[5],
                      (ulong)(session->sessionId).identifier.guid.data4[6],
                      (ulong)(session->sessionId).identifier.guid.data4[7]);
          UA_SecureChannel_detachSession(session->channel,session);
        }
        UA_SecureChannel_attachSession(channel,session);
        session->activated = true;
        UA_Session_updateLifetime(session);
        pUVar1 = session->channel;
        if (pUVar1 == (UA_SecureChannel *)0x0) {
          uVar7 = 0;
          uVar8 = 0;
        }
        else {
          if (pUVar1->connection == (UA_Connection *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(uint)pUVar1->connection->sockfd;
          }
          uVar8 = (ulong)(pUVar1->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Session activated"
                    ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        return;
      }
    }
    else if ((pUVar2 == (UA_DataType *)0x13c290 & (server->config).enableUsernamePasswordLogin) == 1
            ) {
      pUVar3 = (UA_String *)(request->userIdentityToken).content.decoded.data;
      UVar5 = UA_String_equal(pUVar3,(UA_String *)&ap.data);
      if (((UVar5) && (pUVar3[3].length == 0)) &&
         ((pUVar3[1].length != 0 || (pUVar3[2].length != 0)))) {
        sVar9 = (server->config).usernamePasswordLoginsSize;
        lVar10 = 0x10;
        while( true ) {
          bVar11 = sVar9 == 0;
          sVar9 = sVar9 - 1;
          if (bVar11) {
            pUVar1 = session->channel;
            if (pUVar1 == (UA_SecureChannel *)0x0) {
              uVar7 = 0;
              uVar8 = 0;
            }
            else {
              if (pUVar1->connection == (UA_Connection *)0x0) {
                uVar7 = 0;
              }
              else {
                uVar7 = (ulong)(uint)pUVar1->connection->sockfd;
              }
              uVar8 = (ulong)(pUVar1->securityToken).channelId;
            }
            UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                        "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Did not find matching username/password"
                        ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                        (ulong)(session->sessionId).identifier.guid.data2,
                        (ulong)(session->sessionId).identifier.guid.data3,
                        (ulong)(session->sessionId).identifier.guid.data4[0],
                        (ulong)(session->sessionId).identifier.guid.data4[1],
                        (ulong)(session->sessionId).identifier.guid.data4[2],
                        (ulong)(session->sessionId).identifier.guid.data4[3],
                        (ulong)(session->sessionId).identifier.guid.data4[4],
                        (ulong)(session->sessionId).identifier.guid.data4[5],
                        (ulong)(session->sessionId).identifier.guid.data4[6],
                        (ulong)(session->sessionId).identifier.guid.data4[7]);
            (response->responseHeader).serviceResult = 0x801f0000;
            return;
          }
          pUVar4 = (server->config).usernamePasswordLogins;
          UVar5 = UA_String_equal(pUVar3 + 1,(UA_String *)((long)pUVar4 + lVar10 + -0x10));
          if ((UVar5) &&
             (UVar5 = UA_String_equal(pUVar3 + 2,
                                      (UA_String *)((long)&(pUVar4->username).length + lVar10)),
             UVar5)) break;
          lVar10 = lVar10 + 0x20;
        }
        goto LAB_0011b45c;
      }
    }
  }
  (response->responseHeader).serviceResult = 0x80200000;
  return;
}

Assistant:

void
Service_ActivateSession(UA_Server *server, UA_SecureChannel *channel,
                        UA_Session *session, const UA_ActivateSessionRequest *request,
                        UA_ActivateSessionResponse *response) {
    if(session->validTill < UA_DateTime_nowMonotonic()) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the session has timed out", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSESSIONIDINVALID;
        return;
    }

    if(request->userIdentityToken.encoding < UA_EXTENSIONOBJECT_DECODED ||
       (request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN] &&
        request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN])) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the UserIdentify token is invalid", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }


    UA_String ap = UA_STRING(ANONYMOUS_POLICY);
    UA_String up = UA_STRING(USERNAME_POLICY);

    /* Compatibility notice: Siemens OPC Scout v10 provides an empty policyId,
       this is not okay For compatibility we will assume that empty policyId == ANONYMOUS_POLICY
       if(token.policyId->data == NULL)
           response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
    */

    if(server->config.enableAnonymousLogin &&
       request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN]) {
        /* anonymous login */
        const UA_AnonymousIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(token->policyId.data && !UA_String_equal(&token->policyId, &ap)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
    } else if(server->config.enableUsernamePasswordLogin &&
              request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN]) {
        /* username login */
        const UA_UserNameIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(!UA_String_equal(&token->policyId, &up)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
        if(token->encryptionAlgorithm.length > 0) {
            /* we don't support encryption */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        if(token->userName.length == 0 && token->password.length == 0) {
            /* empty username and password */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        /* trying to match pw/username */
        UA_Boolean match = false;
        for(size_t i = 0; i < server->config.usernamePasswordLoginsSize; ++i) {
            UA_String *user = &server->config.usernamePasswordLogins[i].username;
            UA_String *pw = &server->config.usernamePasswordLogins[i].password;
            if(UA_String_equal(&token->userName, user) && UA_String_equal(&token->password, pw)) {
                match = true;
                break;
            }
        }
        if(!match) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "ActivateSession: Did not find matching username/password");
            response->responseHeader.serviceResult = UA_STATUSCODE_BADUSERACCESSDENIED;
            return;
        }
    } else {
        /* Unsupported token type */
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }

    /* Detach the old SecureChannel */
    if(session->channel && session->channel != channel) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Detach from old channel");
        UA_SecureChannel_detachSession(session->channel, session);
    }

    /* Attach to the SecureChannel and activate */
    UA_SecureChannel_attachSession(channel, session);
    session->activated = true;
    UA_Session_updateLifetime(session);
    UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Session activated");
}